

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_modinfo.hpp
# Opt level: O0

void __thiscall
ELFIO::modinfo_section_accessor_template<const_ELFIO::section>::process_section
          (modinfo_section_accessor_template<const_ELFIO::section> *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *__s;
  long lVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined8 local_60;
  size_t loc;
  allocator<char> local_41;
  string local_40 [8];
  string info;
  Elf_Xword i;
  char *pdata;
  modinfo_section_accessor_template<const_ELFIO::section> *this_local;
  long lVar4;
  
  iVar3 = (*this->modinfo_section->_vptr_section[0x18])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  if (lVar4 != 0) {
    info.field_2._8_8_ = 0;
    while (uVar1 = info.field_2._8_8_, iVar3 = (*this->modinfo_section->_vptr_section[0x13])(),
          (ulong)uVar1 < CONCAT44(extraout_var_00,iVar3)) {
      while( true ) {
        uVar1 = info.field_2._8_8_;
        iVar3 = (*this->modinfo_section->_vptr_section[0x13])();
        uVar2 = info.field_2._8_8_;
        bVar6 = false;
        if ((ulong)uVar1 < CONCAT44(extraout_var_01,iVar3)) {
          bVar6 = *(char *)(lVar4 + info.field_2._8_8_) == '\0';
        }
        if (!bVar6) break;
        info.field_2._8_8_ = info.field_2._8_8_ + 1;
      }
      iVar3 = (*this->modinfo_section->_vptr_section[0x13])();
      if ((ulong)uVar2 < CONCAT44(extraout_var_02,iVar3)) {
        __s = (char *)(lVar4 + info.field_2._8_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_40,__s,&local_41);
        std::allocator<char>::~allocator(&local_41);
        local_60 = std::__cxx11::string::find((char)local_40,0x3d);
        std::__cxx11::string::substr((ulong)&local_80,(ulong)local_40);
        std::__cxx11::string::substr((ulong)&local_a0,(ulong)local_40);
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::__cxx11::string,std::__cxx11::string>
                  ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    *)&this->content,&local_80,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_80);
        lVar5 = std::__cxx11::string::length();
        info.field_2._8_8_ = lVar5 + info.field_2._8_8_;
        std::__cxx11::string::~string(local_40);
      }
    }
  }
  return;
}

Assistant:

void process_section()
    {
        const char* pdata = modinfo_section->get_data();
        if ( pdata ) {
            ELFIO::Elf_Xword i = 0;
            while ( i < modinfo_section->get_size() ) {
                while ( i < modinfo_section->get_size() && !pdata[i] )
                    i++;
                if ( i < modinfo_section->get_size() ) {
                    std::string info = pdata + i;
                    size_t      loc  = info.find( '=' );
                    content.emplace_back( info.substr( 0, loc ),
                                          info.substr( loc + 1 ) );

                    i += info.length();
                }
            }
        }
    }